

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumDescriptor::DebugString
          (EnumDescriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options)

{
  int i;
  long lVar1;
  long lVar2;
  string prefix;
  SubstituteArg local_2a8;
  SubstituteArg local_278;
  SubstituteArg local_248;
  SubstituteArg local_218;
  SubstituteArg local_1e8;
  SubstituteArg local_1b8;
  SourceLocationCommentPrinter comment_printer;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  std::__cxx11::string::_M_construct((ulong)&prefix,(char)depth * '\x02');
  comment_printer.source_loc_.leading_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.leading_comments.field_2;
  comment_printer.source_loc_.leading_comments._M_string_length = 0;
  comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.trailing_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.trailing_comments.field_2;
  comment_printer.source_loc_.trailing_comments._M_string_length = 0;
  comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  comment_printer.options_.include_comments = debug_string_options->include_comments;
  comment_printer.options_.elide_group_body = debug_string_options->elide_group_body;
  comment_printer.options_.elide_oneof_body = debug_string_options->elide_oneof_body;
  std::__cxx11::string::string((string *)&comment_printer.prefix_,(string *)&prefix);
  if (debug_string_options->include_comments == true) {
    comment_printer.have_source_loc_ = GetSourceLocation(this,&comment_printer.source_loc_);
  }
  else {
    comment_printer.have_source_loc_ = false;
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment(&comment_printer,contents);
  local_60.text_ = prefix._M_dataplus._M_p;
  local_60.size_ = (int)prefix._M_string_length;
  local_90.text_ = (char *)**(undefined8 **)this;
  local_90.size_ = *(int *)(*(undefined8 **)this + 1);
  local_c0.text_ = (char *)0x0;
  local_c0.size_ = -1;
  local_f0.text_ = (char *)0x0;
  local_f0.size_ = -1;
  local_278.text_ = (char *)0x0;
  local_278.size_ = -1;
  local_2a8.text_ = (char *)0x0;
  local_2a8.size_ = -1;
  local_1b8.text_ = (char *)0x0;
  local_1b8.size_ = -1;
  local_1e8.text_ = (char *)0x0;
  local_1e8.size_ = -1;
  local_218.text_ = (char *)0x0;
  local_218.size_ = -1;
  local_248.text_ = (char *)0x0;
  local_248.size_ = -1;
  strings::SubstituteAndAppend
            (contents,"$0enum $1 {\n",&local_60,&local_90,&local_c0,&local_f0,&local_278,&local_2a8,
             &local_1b8,&local_1e8,&local_218,&local_248);
  anon_unknown_1::FormatLineOptions
            (depth + 1,*(Message **)(this + 0x20),
             *(DescriptorPool **)(*(long *)(this + 0x10) + 0x10),contents);
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < *(int *)(this + 0x2c); lVar1 = lVar1 + 1) {
    EnumValueDescriptor::DebugString
              ((EnumValueDescriptor *)(*(long *)(this + 0x30) + lVar2),depth + 1,contents,
               debug_string_options);
    lVar2 = lVar2 + 0x28;
  }
  local_90.text_ = (char *)0x0;
  local_90.size_ = -1;
  local_c0.text_ = (char *)0x0;
  local_c0.size_ = -1;
  local_f0.text_ = (char *)0x0;
  local_f0.size_ = -1;
  local_278.text_ = (char *)0x0;
  local_278.size_ = -1;
  local_2a8.text_ = (char *)0x0;
  local_2a8.size_ = -1;
  local_1b8.text_ = (char *)0x0;
  local_1b8.size_ = -1;
  local_1e8.text_ = (char *)0x0;
  local_1e8.size_ = -1;
  local_218.text_ = (char *)0x0;
  local_60.text_ = prefix._M_dataplus._M_p;
  local_218.size_ = -1;
  local_248.text_ = (char *)0x0;
  local_60.size_ = (int)prefix._M_string_length;
  local_248.size_ = -1;
  strings::SubstituteAndAppend
            (contents,"$0}\n",&local_60,&local_90,&local_c0,&local_f0,&local_278,&local_2a8,
             &local_1b8,&local_1e8,&local_218,&local_248);
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment(&comment_printer,contents);
  anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter(&comment_printer);
  std::__cxx11::string::~string((string *)&prefix);
  return;
}

Assistant:

void EnumDescriptor::DebugString(int depth, string *contents,
                                 const DebugStringOptions&
                                 debug_string_options) const {
  string prefix(depth * 2, ' ');
  ++depth;

  SourceLocationCommentPrinter
      comment_printer(this, prefix, debug_string_options);
  comment_printer.AddPreComment(contents);

  strings::SubstituteAndAppend(contents, "$0enum $1 {\n",
                               prefix, name());

  FormatLineOptions(depth, options(), file()->pool(), contents);

  for (int i = 0; i < value_count(); i++) {
    value(i)->DebugString(depth, contents, debug_string_options);
  }
  strings::SubstituteAndAppend(contents, "$0}\n", prefix);

  comment_printer.AddPostComment(contents);
}